

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::do_call
          (Dynamic_Object_Function *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  element_type *params_00;
  guard_error *this_00;
  Type_Conversions_State *in_RCX;
  Boxed_Value BVar2;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Dynamic_Object_Function *this_local;
  
  bVar1 = dynamic_object_typename_match
                    ((Dynamic_Object_Function *)params,(Function_Params *)t_conversions,
                     (string *)&params[2].m_end,
                     (unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>
                      *)&params[5].m_end,in_RCX);
  if (!bVar1) {
    this_00 = (guard_error *)__cxa_allocate_exception(0x10);
    exception::guard_error::guard_error(this_00);
    __cxa_throw(this_00,&exception::guard_error::typeinfo,exception::guard_error::~guard_error);
  }
  params_00 = std::
              __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&params[4].m_end);
  BVar2 = Proxy_Function_Base::operator()
                    (&this->super_Proxy_Function_Base,(Function_Params *)params_00,t_conversions);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) const override {
          if (dynamic_object_typename_match(params, m_type_name, m_ti, t_conversions)) {
            return (*m_func)(params, t_conversions);
          } else {
            throw exception::guard_error();
          }
        }